

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Table::Copy
                 (Store *store,Table *dst,u32 dst_offset,Table *src,u32 src_offset,u32 size)

{
  bool bVar1;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  __result;
  Ref lhs;
  Ref rhs;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  dst_end;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_68;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  dst_begin;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  src_end;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_50;
  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  src_begin;
  u32 size_local;
  u32 src_offset_local;
  Table *src_local;
  u32 dst_offset_local;
  Table *dst_local;
  Store *store_local;
  
  bVar1 = IsValidRange(dst,dst_offset,size);
  if ((bVar1) && (bVar1 = IsValidRange(src,src_offset,size), bVar1)) {
    src_begin._M_current = *(Ref **)&(src->type_).super_ExternType.field_0xc;
    bVar1 = TypesMatch(*(ValueType *)&(dst->type_).super_ExternType.field_0xc,
                       (ValueType)src_begin._M_current);
    if (bVar1) {
      src_end._M_current =
           (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin
                            (&src->elements_);
      local_50 = __gnu_cxx::
                 __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&src_end,(ulong)src_offset);
      dst_begin._M_current =
           (Ref *)__gnu_cxx::
                  __normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                  ::operator+(&local_50,(ulong)size);
      dst_end._M_current =
           (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin
                            (&dst->elements_);
      local_68 = __gnu_cxx::
                 __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&dst_end,(ulong)dst_offset);
      __result = __gnu_cxx::
                 __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                 ::operator+(&local_68,(ulong)size);
      lhs = Object::self((Object *)dst);
      rhs = Object::self((Object *)src);
      bVar1 = interp::operator==(lhs,rhs);
      if ((bVar1) && (bVar1 = __gnu_cxx::operator<(&local_50,&local_68), bVar1)) {
        std::
        move_backward<__gnu_cxx::__normal_iterator<wabt::interp::Ref_const*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>,__gnu_cxx::__normal_iterator<wabt::interp::Ref*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>>
                  (local_50,(__normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                             )dst_begin._M_current,__result);
      }
      else {
        std::
        move<__gnu_cxx::__normal_iterator<wabt::interp::Ref_const*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>,__gnu_cxx::__normal_iterator<wabt::interp::Ref*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>>
                  (local_50,(__normal_iterator<const_wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                             )dst_begin._M_current,local_68);
      }
      Result::Result((Result *)((long)&store_local + 4),Ok);
      return (Result)store_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&store_local + 4),Error);
  return (Result)store_local._4_4_;
}

Assistant:

Result Table::Copy(Store& store,
                   Table& dst,
                   u32 dst_offset,
                   const Table& src,
                   u32 src_offset,
                   u32 size) {
  if (dst.IsValidRange(dst_offset, size) &&
      src.IsValidRange(src_offset, size) &&
      TypesMatch(dst.type_.element, src.type_.element)) {
    auto src_begin = src.elements_.begin() + src_offset;
    auto src_end = src_begin + size;
    auto dst_begin = dst.elements_.begin() + dst_offset;
    auto dst_end = dst_begin + size;
    if (dst.self() == src.self() && src_begin < dst_begin) {
      std::move_backward(src_begin, src_end, dst_end);
    } else {
      std::move(src_begin, src_end, dst_begin);
    }
    return Result::Ok;
  }
  return Result::Error;
}